

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall
QHttpNetworkRequest::QHttpNetworkRequest
          (QHttpNetworkRequest *this,QUrl *url,Operation operation,Priority priority)

{
  QHttpNetworkRequestPrivate *this_00;
  
  (this->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader =
       (_func_int **)&PTR__QHttpNetworkRequest_002cdab0;
  this_00 = (QHttpNetworkRequestPrivate *)operator_new(0xd0);
  QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate(this_00,operation,priority,url);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(this_00->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  return;
}

Assistant:

QHttpNetworkRequest::QHttpNetworkRequest(const QUrl &url, Operation operation, Priority priority)
    : d(new QHttpNetworkRequestPrivate(operation, priority, url))
{
}